

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpClient.cpp
# Opt level: O0

optional<Vault::HttpResponse> * __thiscall
Vault::HttpClient::executeRequest
          (optional<Vault::HttpResponse> *__return_storage_ptr__,HttpClient *this,Url *url,
          Token *token,Namespace *ns,CurlSetupCallback *setupCallback,
          CurlHeaderCallback *curlHeaderCallback,HttpErrorCallback *errorCallback)

{
  bool bVar1;
  long *plVar2;
  char *pcVar3;
  Tiny<Vault::ThresholdDetail,_long> local_170;
  Tiny<Vault::TimeoutDetail,_long> local_168;
  Tiny<Vault::TimeoutDetail,_long> local_160;
  Tiny<Vault::TimeoutDetail,_long> local_158;
  path local_150;
  string local_128;
  path local_108;
  allocator<char> local_d9;
  string local_d8;
  string local_b8;
  string local_88;
  undefined1 local_68 [8];
  CurlWrapper curlWrapper;
  CurlSetupCallback *setupCallback_local;
  Namespace *ns_local;
  Token *token_local;
  Url *url_local;
  HttpClient *this_local;
  
  curlWrapper.errorCallback_._M_invoker = (_Invoker_type)setupCallback;
  CurlWrapper::CurlWrapper((CurlWrapper *)local_68,errorCallback);
  bVar1 = Tiny<Vault::TokenDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::empty(token);
  if (!bVar1) {
    Vault::operator+(&local_88,"X-Vault-Token: ",token);
    CurlWrapper::appendHeader((CurlWrapper *)local_68,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
  }
  bVar1 = Tiny<Vault::NamespaceDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::empty(ns);
  if (!bVar1) {
    Vault::operator+(&local_b8,"X-Vault-Namespace: ",ns);
    CurlWrapper::appendHeader((CurlWrapper *)local_68,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,"Content-Type: application/json",&local_d9);
  CurlWrapper::appendHeader((CurlWrapper *)local_68,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator(&local_d9);
  CurlWrapper::setupHeaders((CurlWrapper *)local_68,curlHeaderCallback);
  bVar1 = Config::getVerify(&this->config_);
  if (bVar1) {
    Config::getCaBundle_abi_cxx11_(&local_108,&this->config_);
    bVar1 = std::filesystem::__cxx11::path::empty(&local_108);
    std::filesystem::__cxx11::path::~path(&local_108);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      Config::getCaBundle_abi_cxx11_(&local_150,&this->config_);
      std::filesystem::__cxx11::path::u8string(&local_128,&local_150);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      CurlWrapper::setOption<char_const*>((CurlWrapper *)local_68,CURLOPT_CAINFO,pcVar3);
      std::__cxx11::string::~string((string *)&local_128);
      std::filesystem::__cxx11::path::~path(&local_150);
    }
    CurlWrapper::setOption<long>((CurlWrapper *)local_68,CURLOPT_SSL_VERIFYPEER,1);
    CurlWrapper::setOption<long>((CurlWrapper *)local_68,CURLOPT_SSL_VERIFYHOST,1);
  }
  else {
    CurlWrapper::setOption<long>((CurlWrapper *)local_68,CURLOPT_SSL_VERIFYPEER,0);
    CurlWrapper::setOption<long>((CurlWrapper *)local_68,CURLOPT_SSL_VERIFYHOST,0);
  }
  local_158.value_ = (long)Config::getConnectTimeout(&this->config_);
  plVar2 = Tiny<Vault::TimeoutDetail,_long>::value(&local_158);
  CurlWrapper::setOption<long>((CurlWrapper *)local_68,CURLOPT_CONNECTTIMEOUT,*plVar2);
  local_160.value_ = (long)Config::getRequestTimeout(&this->config_);
  plVar2 = Tiny<Vault::TimeoutDetail,_long>::value(&local_160);
  CurlWrapper::setOption<long>((CurlWrapper *)local_68,CURLOPT_TIMEOUT,*plVar2);
  local_168.value_ = (long)Config::getLowSpeedTimeout(&this->config_);
  plVar2 = Tiny<Vault::TimeoutDetail,_long>::value(&local_168);
  CurlWrapper::setOption<long>((CurlWrapper *)local_68,CURLOPT_LOW_SPEED_TIME,*plVar2);
  local_170.value_ = (long)Config::getLowSpeedLimit(&this->config_);
  plVar2 = Tiny<Vault::ThresholdDetail,_long>::value(&local_170);
  CurlWrapper::setOption<long>((CurlWrapper *)local_68,CURLOPT_LOW_SPEED_LIMIT,*plVar2);
  Tiny<Vault::UrlDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::value(url);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  CurlWrapper::setOption<char_const*>((CurlWrapper *)local_68,CURLOPT_URL,pcVar3);
  bVar1 = Config::getDebug(&this->config_);
  if (bVar1) {
    CurlWrapper::setOption<long>((CurlWrapper *)local_68,CURLOPT_VERBOSE,1);
  }
  CurlWrapper::setupOptions
            ((CurlWrapper *)local_68,(CurlSetupCallback *)curlWrapper.errorCallback_._M_invoker);
  CurlWrapper::execute(__return_storage_ptr__,(CurlWrapper *)local_68);
  CurlWrapper::~CurlWrapper((CurlWrapper *)local_68);
  return __return_storage_ptr__;
}

Assistant:

std::optional<Vault::HttpResponse> Vault::HttpClient::executeRequest(
    const Vault::Url &url, const Vault::Token &token,
    const Vault::Namespace &ns, const Vault::CurlSetupCallback &setupCallback,
    const Vault::CurlHeaderCallback &curlHeaderCallback,
    const Vault::HttpErrorCallback &errorCallback) const {
  CurlWrapper curlWrapper{errorCallback};

  if (!token.empty()) {
    curlWrapper.appendHeader("X-Vault-Token: " + token);
  }

  if (!ns.empty()) {
    curlWrapper.appendHeader("X-Vault-Namespace: " + ns);
  }

  curlWrapper.appendHeader("Content-Type: application/json");
  curlWrapper.setupHeaders(curlHeaderCallback);

  if (config_.getVerify()) {
    if (!config_.getCaBundle().empty()) {
      curlWrapper.setOption(CURLOPT_CAINFO,
                            config_.getCaBundle().u8string().c_str());
    }

    curlWrapper.setOption(CURLOPT_SSL_VERIFYPEER, 1L);
    curlWrapper.setOption(CURLOPT_SSL_VERIFYHOST, 1L);
  } else {
    curlWrapper.setOption(CURLOPT_SSL_VERIFYPEER, 0L);
    curlWrapper.setOption(CURLOPT_SSL_VERIFYHOST, 0L);
  }

  curlWrapper.setOption(CURLOPT_CONNECTTIMEOUT,
                        config_.getConnectTimeout().value());
  curlWrapper.setOption(CURLOPT_TIMEOUT, config_.getRequestTimeout().value());
  curlWrapper.setOption(CURLOPT_LOW_SPEED_TIME,
                        config_.getLowSpeedTimeout().value());
  curlWrapper.setOption(CURLOPT_LOW_SPEED_LIMIT,
                        config_.getLowSpeedLimit().value());
  curlWrapper.setOption(CURLOPT_URL, url.value().c_str());

  if (config_.getDebug()) {
    curlWrapper.setOption(CURLOPT_VERBOSE, 1L);
  }

  curlWrapper.setupOptions(setupCallback);

  return curlWrapper.execute();
}